

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool roaring_previous_uint32_iterator(roaring_uint32_iterator_t *it)

{
  uint8_t uVar1;
  void *pvVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  bool bVar6;
  run_container_t *run_container;
  array_container_t *array_container;
  ulong uStack_30;
  int num_leading_zeros;
  uint64_t word;
  int32_t wordindex;
  bitset_container_t *bitset_container;
  roaring_uint32_iterator_t *it_local;
  
  if (it->container_index < 0) {
    it->has_value = false;
    it_local._7_1_ = false;
  }
  else if (it->container_index < (it->parent->high_low_container).size) {
    uVar1 = it->typecode;
    if (uVar1 == '\x01') {
      iVar5 = it->in_container_index + -1;
      it->in_container_index = iVar5;
      if (-1 < iVar5) {
        word._4_4_ = it->in_container_index / 0x40;
        uStack_30 = *(ulong *)(*(long *)((long)it->container + 8) + (long)word._4_4_ * 8) &
                    0xffffffffffffffffU >> (0x3fU - (char)(it->in_container_index % 0x40) & 0x3f);
        while( true ) {
          bVar6 = false;
          if (uStack_30 == 0) {
            word._4_4_ = word._4_4_ + -1;
            bVar6 = -1 < word._4_4_;
          }
          if (!bVar6) break;
          uStack_30 = *(ulong *)(*(long *)((long)it->container + 8) + (long)word._4_4_ * 8);
        }
        if (uStack_30 != 0) {
          lVar3 = 0x3f;
          if (uStack_30 != 0) {
            for (; uStack_30 >> lVar3 == 0; lVar3 = lVar3 + -1) {
            }
          }
          it->in_container_index = word._4_4_ * 0x40 + (0x3f - ((uint)lVar3 ^ 0x3f));
          it->current_value = it->highbits | it->in_container_index;
          it->has_value = true;
          return true;
        }
      }
    }
    else if (uVar1 == '\x02') {
      iVar5 = it->in_container_index + -1;
      it->in_container_index = iVar5;
      if (-1 < iVar5) {
        it->current_value =
             it->highbits |
             (uint)*(ushort *)
                    (*(long *)((long)it->container + 8) + (long)it->in_container_index * 2);
        it->has_value = true;
        return true;
      }
    }
    else {
      if (uVar1 != '\x03') {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x4164,"_Bool roaring_previous_uint32_iterator(roaring_uint32_iterator_t *)")
        ;
      }
      if (it->current_value == 0) {
        it->has_value = false;
        return false;
      }
      pvVar2 = it->container;
      uVar4 = it->current_value - 1;
      it->current_value = uVar4;
      if ((it->highbits | (uint)*(ushort *)(*(long *)((long)pvVar2 + 8) + (long)it->run_index * 4))
          <= uVar4) {
        it->has_value = true;
        return true;
      }
      iVar5 = it->run_index + -1;
      it->run_index = iVar5;
      if (-1 < iVar5) {
        it->current_value =
             it->highbits |
             (uint)*(ushort *)(*(long *)((long)pvVar2 + 8) + (long)it->run_index * 4) +
             (uint)*(ushort *)(*(long *)((long)pvVar2 + 8) + 2 + (long)it->run_index * 4);
        it->has_value = true;
        return true;
      }
    }
    it->container_index = it->container_index + -1;
    it_local._7_1_ = loadlastvalue(it);
    it->has_value = it_local._7_1_;
  }
  else {
    it->container_index = (it->parent->high_low_container).size + -1;
    it_local._7_1_ = loadlastvalue(it);
    it->has_value = it_local._7_1_;
  }
  return it_local._7_1_;
}

Assistant:

bool roaring_previous_uint32_iterator(roaring_uint32_iterator_t *it) {
    if (it->container_index < 0) {
        return (it->has_value = false);
    }
    if (it->container_index >= it->parent->high_low_container.size) {
        it->container_index = it->parent->high_low_container.size - 1;
        return (it->has_value = loadlastvalue(it));
    }

    switch (it->typecode) {
        case BITSET_CONTAINER_TYPE: {
            if (--it->in_container_index < 0)
                break;

            const bitset_container_t* bitset_container = (const bitset_container_t*)it->container;
            int32_t wordindex = it->in_container_index / 64;
            uint64_t word = bitset_container->words[wordindex] & (UINT64_MAX >> (63 - (it->in_container_index % 64)));

            while (word == 0 && --wordindex >= 0) {
                word = bitset_container->words[wordindex];
            }
            if (word == 0)
                break;

            int num_leading_zeros = __builtin_clzll(word);
            it->in_container_index = (wordindex * 64) + (63 - num_leading_zeros);
            it->current_value = it->highbits | it->in_container_index;
            return (it->has_value = true);
        }
        case ARRAY_CONTAINER_TYPE: {
            if (--it->in_container_index < 0)
                break;

            const array_container_t* array_container = (const array_container_t*)it->container;
            it->current_value = it->highbits | array_container->array[it->in_container_index];
            return (it->has_value = true);
        }
        case RUN_CONTAINER_TYPE: {
            if(it->current_value == 0)
                return (it->has_value = false);

            const run_container_t* run_container = (const run_container_t*)it->container;
            if (--it->current_value >= (it->highbits | run_container->runs[it->run_index].value)) {
                return (it->has_value = true);
            }

            if (--it->run_index < 0)
                break;

            it->current_value = it->highbits | (run_container->runs[it->run_index].value +
                                                run_container->runs[it->run_index].length);
            return (it->has_value = true);
        }
        default:
            // if this ever happens, bug!
            assert(false);
    }  // switch (typecode)

    // moving to previous container
    it->container_index--;
    return (it->has_value = loadlastvalue(it));
}